

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O2

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse2>::weight_from_cos
          (PolarExtentCoreSimd<xsimd::sse2> *this,PolarExtentCoreContext *ctx,batch cos_angle)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  undefined4 in_EAX;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar9;
  float fVar10;
  ulong uVar11;
  batch<float,_xsimd::sse2> bVar12;
  batch bVar13;
  batch<float,_xsimd::sse2> local_18;
  
  fVar9 = cos_angle.super_simd_register<float,_xsimd::sse2>.data[2];
  fVar10 = cos_angle.super_simd_register<float,_xsimd::sse2>.data[3];
  local_18.super_simd_register<float,_xsimd::sse2>.data[2] = in_XMM0_Dc;
  local_18.super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)cos_angle.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_18.super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)cos_angle.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_18.super_simd_register<float,_xsimd::sse2>.data[3] = in_XMM0_Dd;
  fVar3 = ctx->cos_start_angle;
  uVar5 = -(uint)(cos_angle.super_simd_register<float,_xsimd::sse2>.data[0] < fVar3);
  uVar7 = -(uint)(cos_angle.super_simd_register<float,_xsimd::sse2>.data[1] < fVar3);
  auVar2._4_4_ = uVar7;
  auVar2._0_4_ = uVar5;
  auVar2._8_4_ = -(uint)(in_XMM0_Dc < fVar3);
  auVar2._12_4_ = -(uint)(in_XMM0_Dd < fVar3);
  iVar4 = movmskps(in_EAX,auVar2);
  if (iVar4 == 0) {
    uVar11 = 0x3f8000003f800000;
  }
  else {
    fVar9 = ctx->cos_end_angle;
    uVar6 = -(uint)(fVar9 < cos_angle.super_simd_register<float,_xsimd::sse2>.data[0]);
    uVar8 = -(uint)(fVar9 < cos_angle.super_simd_register<float,_xsimd::sse2>.data[1]);
    auVar1._4_4_ = uVar8;
    auVar1._0_4_ = uVar6;
    auVar1._8_4_ = -(uint)(fVar9 < in_XMM0_Dc);
    auVar1._12_4_ = -(uint)(fVar9 < in_XMM0_Dd);
    iVar4 = movmskps(iVar4,auVar1);
    if (iVar4 == 0) {
      uVar11 = 0;
      fVar10 = fVar9;
    }
    else {
      fVar3 = ctx->m;
      bVar12 = xsimd::acos<float,xsimd::sse2>(&local_18);
      fVar9 = ctx->c + bVar12.super_simd_register<float,_xsimd::sse2>.data[0] * fVar3;
      fVar10 = ctx->c + bVar12.super_simd_register<float,_xsimd::sse2>.data[1] * fVar3;
      uVar11 = CONCAT44(uVar8 & uVar7 & (uint)fVar10,uVar6 & uVar5 & (uint)fVar9) |
               CONCAT44(~uVar7,~uVar5) & 0x3f8000003f800000;
    }
  }
  bVar13.super_simd_register<float,_xsimd::sse2>.data[3] = fVar10;
  bVar13.super_simd_register<float,_xsimd::sse2>.data[2] = fVar9;
  bVar13.super_simd_register<float,_xsimd::sse2>.data[0] = (float)(int)uVar11;
  bVar13.super_simd_register<float,_xsimd::sse2>.data[1] = (float)(int)(uVar11 >> 0x20);
  return (batch)bVar13.super_simd_register<float,_xsimd::sse2>.data;
}

Assistant:

batch weight_from_cos(PolarExtentCoreContext &ctx, batch cos_angle) const {
      auto start = cos_angle >= ctx.cos_start_angle;
      auto end = cos_angle <= ctx.cos_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::acos(cos_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }